

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteDbRelease(unqlite *pDb)

{
  int iVar1;
  unqlite_vm *puVar2;
  jx9 *pEngine;
  jx9 *pjVar3;
  jx9 *pjVar4;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  int iVar5;
  Pager *pPVar6;
  unqlite_vm *puVar7;
  
  pPVar6 = (pDb->sDB).pPager;
  if ((pDb->iFlags & 1) == 0) {
    iVar5 = unqlitePagerCommit(pPVar6);
    if (iVar5 == 0) {
      iVar5 = 0;
      goto LAB_0010b80d;
    }
    pPVar6 = (pDb->sDB).pPager;
  }
  iVar5 = unqlitePagerRollback(pPVar6,0);
LAB_0010b80d:
  pPVar6 = (pDb->sDB).pPager;
  pager_release_kv_engine(pPVar6);
  if (((pPVar6->iOpenFlags & 0x100) != 0) && (pPVar6->pMmap != (void *)0x0)) {
    munmap(pPVar6->pMmap,pPVar6->dbByteSize);
  }
  if ((pPVar6->is_mem == 0) && (-1 < pPVar6->iState)) {
    if (pPVar6->iLock != 0) {
      (*pPVar6->pfd->pMethods->xUnlock)(pPVar6->pfd,0);
      pPVar6->iLock = 0;
    }
    pChunk = pPVar6->pfd;
    if (pChunk != (unqlite_file *)0x0) {
      pBackend = pPVar6->pAllocator;
      (*pChunk->pMethods->xClose)(pChunk);
      SyMemBackendFree(pBackend,pChunk);
    }
  }
  if (pPVar6->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPVar6->pVec);
    pPVar6->pVec = (Bitvec *)0x0;
  }
  if (0 < pDb->iVm) {
    puVar7 = pDb->pVms;
    do {
      puVar2 = puVar7->pNext;
      jx9_vm_release(puVar7->pJx9Vm);
      SyMemBackendRelease(&puVar7->sAlloc);
      iVar1 = pDb->iVm;
      pDb->iVm = iVar1 + -1;
      puVar7 = puVar2;
    } while (1 < iVar1);
  }
  pEngine = (pDb->sDB).pJx9;
  if ((pEngine != (jx9 *)0x0) && (pEngine->nMagic == 0xf874bcd7)) {
    EngineRelease(pEngine);
    if (sJx9MPGlobal.pEngines == pEngine) {
      sJx9MPGlobal.pEngines = (sJx9MPGlobal.pEngines)->pNext;
    }
    pjVar3 = pEngine->pNext;
    pjVar4 = pEngine->pPrev;
    if (pjVar4 != (jx9 *)0x0) {
      pjVar4->pNext = pjVar3;
    }
    if (pjVar3 != (jx9 *)0x0) {
      pjVar3->pPrev = pjVar4;
    }
    sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + -1;
    SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pEngine);
  }
  pDb->nMagic = 0x7250;
  SyMemBackendRelease(&pDb->sMem);
  return iVar5;
}

Assistant:

static int unqliteDbRelease(unqlite *pDb)
{
	unqlite_db *pStore = &pDb->sDB;
	unqlite_vm *pVm,*pNext;
	int rc = UNQLITE_OK;
	if( (pDb->iFlags & UNQLITE_FL_DISABLE_AUTO_COMMIT) == 0 ){
		/* Commit any outstanding transaction */
		rc = unqlitePagerCommit(pStore->pPager);
		if( rc != UNQLITE_OK ){
			/* Rollback the transaction */
			rc = unqlitePagerRollback(pStore->pPager,FALSE);
		}
	}else{
		/* Rollback any outstanding transaction */
		rc = unqlitePagerRollback(pStore->pPager,FALSE);
	}
	/* Close the pager */
	unqlitePagerClose(pStore->pPager);
	/* Release any active VM's */
	pVm = pDb->pVms;
	for(;;){
		if( pDb->iVm < 1 ){
			break;
		}
		/* Point to the next entry */
		pNext = pVm->pNext;
		unqliteVmRelease(pVm);
		pVm = pNext;
		pDb->iVm--;
	}
	/* Release the Jx9 handle */
	jx9_release(pStore->pJx9);
	/* Set a dummy magic number */
	pDb->nMagic = 0x7250;
	/* Release the whole memory subsystem */
	SyMemBackendRelease(&pDb->sMem);
	/* Commit or rollback result */
	return rc;
}